

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall upb::generator::Output::operator()<>(Output *this,string_view format)

{
  char *in_RCX;
  string_view format_00;
  string local_50;
  string_view local_30;
  Output *local_20;
  Output *this_local;
  string_view format_local;
  
  format_00._M_len = format._M_str;
  this_local = (Output *)format._M_len;
  format_00._M_str = in_RCX;
  local_20 = this;
  format_local._M_len = (size_t)format_00._M_len;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_50,(lts_20250127 *)this_local,format_00);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  Write(this,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }